

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtcnn.cpp
# Opt level: O0

void __thiscall Pnet::~Pnet(Pnet *this)

{
  Pnet *this_local;
  
  freepBox(this->rgb);
  freepBox(this->conv1);
  freepBox(this->maxPooling1);
  freepBox(this->conv2);
  freepBox(this->conv3);
  freepBox(this->score_);
  freepBox(this->location_);
  freeWeight(this->conv1_wb);
  freepRelu(this->prelu_gmma1);
  freeWeight(this->conv2_wb);
  freepRelu(this->prelu_gmma2);
  freeWeight(this->conv3_wb);
  freepRelu(this->prelu_gmma3);
  freeWeight(this->conv4c1_wb);
  freeWeight(this->conv4c2_wb);
  std::vector<orderScore,_std::allocator<orderScore>_>::~vector(&this->bboxScore_);
  std::vector<Bbox,_std::allocator<Bbox>_>::~vector(&this->boundingBox_);
  return;
}

Assistant:

Pnet::~Pnet() {
    freepBox(this->rgb);
    freepBox(this->conv1);
    freepBox(this->maxPooling1);
    freepBox(this->conv2);
    freepBox(this->conv3);
    freepBox(this->score_);
    freepBox(this->location_);

    freeWeight(this->conv1_wb);
    freepRelu(this->prelu_gmma1);
    freeWeight(this->conv2_wb);
    freepRelu(this->prelu_gmma2);
    freeWeight(this->conv3_wb);
    freepRelu(this->prelu_gmma3);
    freeWeight(this->conv4c1_wb);
    freeWeight(this->conv4c2_wb);
}